

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O0

void __thiscall OpenMD::KirkwoodBuff::writeRdf(KirkwoodBuff *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  bool bVar2;
  _Setw _Var3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  reference pbVar8;
  reference pvVar9;
  reference pvVar10;
  undefined8 uVar11;
  StaticAnalyser *in_RDI;
  uint i_2;
  uint i_1;
  uint i;
  RealType r_1;
  uint j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  Revision r;
  ofstream ofs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa48;
  errorStruct *peVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa50;
  ostream *in_stack_fffffffffffffa60;
  Revision *in_stack_fffffffffffffa68;
  allocator_type *in_stack_fffffffffffffa78;
  allocator<char> *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  Revision *in_stack_fffffffffffffab8;
  string *local_518;
  uint local_3fc;
  uint local_3f4;
  uint local_3ec;
  uint local_3e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b2;
  allocator<char> local_3b1;
  allocator<char> local_3b0;
  allocator<char> local_3af;
  allocator<char> local_3ae;
  allocator<char> local_3ad;
  allocator<char> local_3ac;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  string *local_3a8;
  string local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  string *local_280;
  undefined8 local_278;
  undefined1 local_270 [24];
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar4,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar11 = std::__cxx11::string::c_str();
    peVar12 = &painCave;
    snprintf(painCave.errMsg,2000,"KirkwoodBuff: unable to open %s\n",uVar11);
    peVar12->isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<(local_208,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffab8);
    poVar5 = std::operator<<(poVar5,local_238);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_238);
    poVar5 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar5 = std::operator<<(poVar5,local_258);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_258);
    poVar5 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    poVar5 = std::operator<<(local_208,"\"\tselection script2: \"");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI[1].dumpFilename_.field_2._M_local_buf + 8));
    std::operator<<(poVar5,"\"\n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_208,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    local_3b2 = 1;
    local_3a8 = local_3a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_380;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_360;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_340;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_320;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_2e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_2c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3a8 = (string *)local_2a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    local_3b2 = 0;
    local_280 = local_3a0;
    local_278 = 9;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x15e7f4);
    __l._M_array._4_4_ = in_stack_fffffffffffffa8c;
    __l._M_array._0_4_ = in_stack_fffffffffffffa88;
    __l._M_len = (size_type)in_stack_fffffffffffffa90;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa80,__l,in_stack_fffffffffffffa78);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x15e828);
    local_518 = (string *)&local_280;
    do {
      local_518 = local_518 + -0x20;
      std::__cxx11::string::~string(local_518);
    } while (local_518 != local_3a0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::~allocator(&local_3b0);
    std::allocator<char>::~allocator(&local_3af);
    std::allocator<char>::~allocator(&local_3ae);
    std::allocator<char>::~allocator(&local_3ad);
    std::allocator<char>::~allocator(&local_3ac);
    std::allocator<char>::~allocator(&local_3ab);
    std::allocator<char>::~allocator(&local_3aa);
    std::allocator<char>::~allocator(&local_3a9);
    std::operator<<(local_208,"# r");
    local_3c0 = local_270;
    local_3c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffa48);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffa50,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffa48);
      if (!bVar2) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_3c8);
      poVar5 = std::operator<<(local_208,"\t");
      _Var3 = std::setw(0xf);
      poVar5 = std::operator<<(poVar5,_Var3);
      std::operator<<(poVar5,(string *)pbVar8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3c8);
    }
    std::operator<<(local_208,'\n');
    for (local_3e0 = 0; local_3e0 < in_RDI->nBins_; local_3e0 = local_3e0 + 1) {
      std::ostream::operator<<(local_208,*(double *)&in_RDI[0x14].step_ * (double)local_3e0);
      for (local_3ec = 0; local_3ec < 3; local_3ec = local_3ec + 1) {
        poVar5 = std::operator<<(local_208,"\t");
        _Var3 = std::setw(0xf);
        poVar5 = std::operator<<(poVar5,_Var3);
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&in_RDI[0x14].analysisType_,(ulong)local_3ec);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(ulong)local_3e0);
        std::ostream::operator<<(poVar5,*pvVar10);
      }
      for (local_3f4 = 0; local_3f4 < 3; local_3f4 = local_3f4 + 1) {
        poVar5 = std::operator<<(local_208,"\t");
        _Var3 = std::setw(0xf);
        poVar5 = std::operator<<(poVar5,_Var3);
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)((long)&in_RDI[0x14].analysisType_.field_2 + 8),(ulong)local_3f4);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(ulong)local_3e0);
        std::ostream::operator<<(poVar5,*pvVar10);
      }
      for (local_3fc = 0; local_3fc < 3; local_3fc = local_3fc + 1) {
        in_stack_fffffffffffffa60 = std::operator<<(local_208,"\t");
        _Var3 = std::setw(0xf);
        poVar5 = std::operator<<(in_stack_fffffffffffffa60,_Var3);
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)&in_RDI[0x14].paramString_.field_2,(ulong)local_3fc);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(ulong)local_3e0);
        std::ostream::operator<<(poVar5,*pvVar10);
      }
      std::operator<<(local_208,"\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa60);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void KirkwoodBuff::writeRdf() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      std::vector<std::string> labels {"g11",  "g12", "g22", "gC11", "gC12",
                                       "gC22", "G11", "G12", "G22"};

      ofs << "# r";

      for (const auto& label : labels)
        ofs << "\t" << std::setw(15) << label;

      ofs << '\n';

      for (unsigned int j = 0; j < nBins_; ++j) {
        RealType r = deltaR_ * j;
        ofs << r;
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gofrs_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << gCorr_[i][j];
        }
        for (unsigned int i = 0; i < MaxPairs; ++i) {
          ofs << "\t" << std::setw(15) << G_[i][j];
        }
        ofs << "\n";
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "KirkwoodBuff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }